

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O0

void diy::
     Serialization<std::vector<diy::AMRLink::Description,_std::allocator<diy::AMRLink::Description>_>_>
     ::load(BinaryBuffer *bb,Vector *v)

{
  Description *in_RSI;
  size_t in_RDI;
  size_t s;
  unsigned_long *in_stack_fffffffffffffe68;
  Description *in_stack_fffffffffffffe70;
  Description *x;
  BinaryBuffer *bb_00;
  value_type *in_stack_fffffffffffffe90;
  size_type in_stack_fffffffffffffe98;
  Description *in_stack_fffffffffffffea0;
  BinaryBuffer *local_18;
  
  load<unsigned_long>((BinaryBuffer *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  x = in_RSI;
  bb_00 = local_18;
  memset(&stack0xfffffffffffffea0,0,0x148);
  AMRLink::Description::Description(in_stack_fffffffffffffea0);
  std::vector<diy::AMRLink::Description,_std::allocator<diy::AMRLink::Description>_>::resize
            ((vector<diy::AMRLink::Description,_std::allocator<diy::AMRLink::Description>_> *)
             in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  AMRLink::Description::~Description(in_stack_fffffffffffffe70);
  if (local_18 != (BinaryBuffer *)0x0) {
    std::vector<diy::AMRLink::Description,_std::allocator<diy::AMRLink::Description>_>::operator[]
              ((vector<diy::AMRLink::Description,_std::allocator<diy::AMRLink::Description>_> *)
               in_RSI,0);
    load<diy::AMRLink::Description>(bb_00,x,in_RDI);
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, Vector& v)
    {
      size_t s;
      diy::load(bb, s);
      v.resize(s, U());
      if (s > 0)
        diy::load(bb, &v[0], s);
    }